

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int * tr_median3(int *ISAd,int *v1,int *v2,int *v3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  iVar1 = *v1;
  iVar2 = *v2;
  piVar4 = v2;
  iVar3 = iVar2;
  if (ISAd[iVar2] < ISAd[iVar1]) {
    piVar4 = v1;
    iVar3 = iVar1;
  }
  if (ISAd[*v3] < ISAd[iVar3]) {
    if (ISAd[iVar2] < ISAd[iVar1]) {
      v1 = v2;
      iVar1 = iVar2;
    }
    piVar4 = v3;
    if (ISAd[*v3] < ISAd[iVar1]) {
      piVar4 = v1;
    }
  }
  return piVar4;
}

Assistant:

static INLINE
int *
tr_median3(const int *ISAd, int *v1, int *v2, int *v3) {
  int *t;
  if(ISAd[*v1] > ISAd[*v2]) { SWAP(v1, v2); }
  if(ISAd[*v2] > ISAd[*v3]) {
    if(ISAd[*v1] > ISAd[*v3]) { return v1; }
    else { return v3; }
  }
  return v2;
}